

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

StrongWeakAssertionExpr * __thiscall
slang::BumpAllocator::
emplace<slang::ast::StrongWeakAssertionExpr,slang::ast::AssertionExpr_const&,slang::ast::StrongWeakAssertionExpr::Strength>
          (BumpAllocator *this,AssertionExpr *args,Strength *args_1)

{
  StrongWeakAssertionExpr *this_00;
  Strength *args_local_1;
  AssertionExpr *args_local;
  BumpAllocator *this_local;
  
  this_00 = (StrongWeakAssertionExpr *)allocate(this,0x20,8);
  ast::StrongWeakAssertionExpr::StrongWeakAssertionExpr(this_00,args,*args_1);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }